

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

int __thiscall jpge::jpeg_encoder::init(jpeg_encoder *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  bool bVar2;
  undefined7 extraout_var;
  int in_ECX;
  int in_EDX;
  uint in_R8D;
  int *in_R9;
  
  free(this->m_mcu_lines[0]);
  this->m_mcu_lines[0] = (uint8 *)0x0;
  this->m_pass_num = '\0';
  this->m_all_stream_writes_succeeded = true;
  if (((((0 < in_ECX && 0 < in_EDX) && ctx != (EVP_PKEY_CTX *)0x0) && (in_R8D < 5)) &&
      ((0x1aU >> (in_R8D & 0x1f) & 1) != 0)) && ((*in_R9 - 1U < 100 && ((uint)in_R9[1] < 4)))) {
    this->m_pStream = (output_stream *)ctx;
    iVar1 = in_R9[1];
    (this->m_params).m_quality = in_R9[0];
    (this->m_params).m_subsampling = iVar1;
    iVar1 = in_R9[2];
    (this->m_params).m_no_chroma_discrim_flag = (bool)(char)(short)iVar1;
    (this->m_params).m_two_pass_flag = (bool)(char)((ushort)(short)iVar1 >> 8);
    bVar2 = jpg_open(this,in_EDX,in_ECX,in_R8D);
    return (int)CONCAT71(extraout_var,bVar2);
  }
  return 0;
}

Assistant:

bool jpeg_encoder::init(output_stream *pStream, int width, int height, int src_channels, const params &comp_params)
{
  deinit();
  if (((!pStream) || (width < 1) || (height < 1)) || ((src_channels != 1) && (src_channels != 3) && (src_channels != 4)) || (!comp_params.check())) return false;
  m_pStream = pStream;
  m_params = comp_params;
  return jpg_open(width, height, src_channels);
}